

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O3

void event_base_free_(event_base *base,int run_finalizers)

{
  short *psVar1;
  event *peVar2;
  common_timeout_list *__ptr;
  common_timeout_list **__ptr_00;
  event_callback *peVar3;
  event_once **ppeVar4;
  event_once *__ptr_01;
  _func_void_event_base_ptr *p_Var5;
  event **__ptr_02;
  event *ev;
  int iVar6;
  event_once *peVar7;
  event_base *base_00;
  event_callback *peVar8;
  evcallback_list *__ptr_03;
  uint uVar9;
  long lVar10;
  uint uVar11;
  
  base_00 = event_global_current_base_;
  if (event_global_current_base_ == (event_base *)0x0) {
    base_00 = base;
  }
  if (base != (event_base *)0x0) {
    base_00 = base;
  }
  if (base_00 == (event_base *)0x0) {
    event_warnx("%s: no base to free","event_base_free_");
    return;
  }
  if (base_00->th_notify_fd[0] != -1) {
    peVar2 = &base_00->th_notify;
    event_del_(peVar2,2);
    evutil_closesocket(base_00->th_notify_fd[0]);
    if (base_00->th_notify_fd[1] != -1) {
      evutil_closesocket(base_00->th_notify_fd[1]);
    }
    base_00->th_notify_fd[0] = -1;
    base_00->th_notify_fd[1] = -1;
    event_debug_assert_not_added_(peVar2);
    event_debug_note_teardown_(peVar2);
    psVar1 = &(base_00->th_notify).ev_evcallback.evcb_flags;
    *(byte *)psVar1 = (byte)*psVar1 & 0x7f;
  }
  evmap_delete_all_(base_00);
  if ((base_00->timeheap).n == 0) {
    uVar11 = 0;
  }
  else {
    uVar11 = 0;
    do {
      peVar2 = *(base_00->timeheap).p;
      if (peVar2 == (event *)0x0) break;
      event_del_(peVar2,2);
      uVar11 = uVar11 + 1;
    } while ((base_00->timeheap).n != 0);
  }
  if (0 < base_00->n_common_timeouts) {
    lVar10 = 0;
    do {
      __ptr = base_00->common_timeout_queues[lVar10];
      peVar2 = &__ptr->timeout_event;
      event_del_(peVar2,2);
      event_debug_assert_not_added_(peVar2);
      event_debug_note_teardown_(peVar2);
      psVar1 = &(__ptr->timeout_event).ev_evcallback.evcb_flags;
      *(byte *)psVar1 = (byte)*psVar1 & 0x7f;
      peVar2 = (__ptr->events).tqh_first;
      while (ev = peVar2, ev != (event *)0x0) {
        peVar2 = (ev->ev_timeout_pos).ev_next_with_common_timeout.tqe_next;
        if (((ev->ev_evcallback).evcb_flags & 0x10) == 0) {
          event_del_(ev,2);
          uVar11 = uVar11 + 1;
        }
      }
      if (mm_free_fn_ == (_func_void_void_ptr *)0x0) {
        free(__ptr);
      }
      else {
        (*mm_free_fn_)(__ptr);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < base_00->n_common_timeouts);
  }
  __ptr_00 = base_00->common_timeout_queues;
  if (__ptr_00 != (common_timeout_list **)0x0) {
    if (mm_free_fn_ == (_func_void_void_ptr *)0x0) {
      free(__ptr_00);
    }
    else {
      (*mm_free_fn_)(__ptr_00);
    }
  }
  do {
    iVar6 = base_00->nactivequeues;
    uVar9 = 0;
    if (0 < iVar6) {
      lVar10 = 0;
      uVar9 = 0;
      do {
        peVar8 = base_00->activequeues[lVar10].tqh_first;
        if (peVar8 != (event_callback *)0x0) {
          do {
            peVar3 = (peVar8->evcb_active_next).tqe_next;
            iVar6 = event_base_cancel_single_callback_(base_00,peVar8,run_finalizers);
            uVar9 = uVar9 + iVar6;
            peVar8 = peVar3;
          } while (peVar3 != (event_callback *)0x0);
          iVar6 = base_00->nactivequeues;
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 < iVar6);
    }
    while (peVar8 = (base_00->active_later_queue).tqh_first, peVar8 != (event_callback *)0x0) {
      iVar6 = event_base_cancel_single_callback_(base_00,peVar8,run_finalizers);
      uVar9 = uVar9 + iVar6;
    }
    if (event_debug_logging_mask_ != 0) {
      event_debugx_("%s: %d events freed","event_base_free_",(ulong)uVar9);
    }
    uVar11 = uVar11 + uVar9;
  } while (uVar9 != 0);
  if ((uVar11 != 0) && (event_debug_logging_mask_ != 0)) {
    event_debugx_("%s: %d events were still set in base","event_base_free_",(ulong)uVar11);
  }
  while (__ptr_01 = (base_00->once_events).lh_first, __ptr_01 != (event_once *)0x0) {
    peVar7 = (__ptr_01->next_once).le_next;
    ppeVar4 = (__ptr_01->next_once).le_prev;
    if (peVar7 == (event_once *)0x0) {
      peVar7 = (event_once *)0x0;
    }
    else {
      (peVar7->next_once).le_prev = ppeVar4;
      peVar7 = (__ptr_01->next_once).le_next;
    }
    *ppeVar4 = peVar7;
    if (mm_free_fn_ == (_func_void_void_ptr *)0x0) {
      free(__ptr_01);
    }
    else {
      (*mm_free_fn_)(__ptr_01);
    }
  }
  if ((base_00->evsel != (eventop *)0x0) &&
     (p_Var5 = base_00->evsel->dealloc, p_Var5 != (_func_void_event_base_ptr *)0x0)) {
    (*p_Var5)(base_00);
  }
  if (0 < (long)base_00->nactivequeues) {
    lVar10 = 0;
    do {
      if (*(long *)((long)&base_00->activequeues->tqh_first + lVar10) != 0) {
        event_base_free__cold_1();
        goto LAB_002ccd60;
      }
      lVar10 = lVar10 + 0x10;
    } while ((long)base_00->nactivequeues * 0x10 != lVar10);
  }
  if ((base_00->timeheap).n != 0) {
LAB_002ccd60:
    event_base_free__cold_2();
  }
  __ptr_02 = (base_00->timeheap).p;
  if (__ptr_02 == (event **)0x0) {
LAB_002ccc98:
    __ptr_03 = base_00->activequeues;
    if (mm_free_fn_ != (_func_void_void_ptr *)0x0) {
      (*mm_free_fn_)(__ptr_03);
      goto LAB_002cccb9;
    }
  }
  else {
    if (mm_free_fn_ != (_func_void_void_ptr *)0x0) {
      (*mm_free_fn_)(__ptr_02);
      goto LAB_002ccc98;
    }
    free(__ptr_02);
    __ptr_03 = base_00->activequeues;
  }
  free(__ptr_03);
LAB_002cccb9:
  evmap_io_clear_(&base_00->io);
  evmap_signal_clear_(&base_00->sigmap);
  event_changelist_freemem_(&base_00->changelist);
  if (evthread_lock_fns_.free != (_func_void_void_ptr_uint *)0x0 &&
      base_00->th_base_lock != (void *)0x0) {
    (*evthread_lock_fns_.free)(base_00->th_base_lock,0);
  }
  if (base_00->current_event_cond != (void *)0x0) {
    (*evthread_cond_fns_.free_condition)(base_00->current_event_cond);
  }
  if (base_00 == event_global_current_base_) {
    event_global_current_base_ = (event_base *)0x0;
  }
  if (mm_free_fn_ != (_func_void_void_ptr *)0x0) {
    (*mm_free_fn_)(base_00);
    return;
  }
  free(base_00);
  return;
}

Assistant:

static void
event_base_free_(struct event_base *base, int run_finalizers)
{
	int i, n_deleted=0;
	struct event *ev;
	/* XXXX grab the lock? If there is contention when one thread frees
	 * the base, then the contending thread will be very sad soon. */

	/* event_base_free(NULL) is how to free the current_base if we
	 * made it with event_init and forgot to hold a reference to it. */
	if (base == NULL && current_base)
		base = current_base;
	/* Don't actually free NULL. */
	if (base == NULL) {
		event_warnx("%s: no base to free", __func__);
		return;
	}
	/* XXX(niels) - check for internal events first */

#ifdef _WIN32
	event_base_stop_iocp_(base);
#endif

	/* threading fds if we have them */
	if (base->th_notify_fd[0] != -1) {
		event_del(&base->th_notify);
		EVUTIL_CLOSESOCKET(base->th_notify_fd[0]);
		if (base->th_notify_fd[1] != -1)
			EVUTIL_CLOSESOCKET(base->th_notify_fd[1]);
		base->th_notify_fd[0] = -1;
		base->th_notify_fd[1] = -1;
		event_debug_unassign(&base->th_notify);
	}

	/* Delete all non-internal events. */
	evmap_delete_all_(base);

	while ((ev = min_heap_top_(&base->timeheap)) != NULL) {
		event_del(ev);
		++n_deleted;
	}
	for (i = 0; i < base->n_common_timeouts; ++i) {
		struct common_timeout_list *ctl =
		    base->common_timeout_queues[i];
		event_del(&ctl->timeout_event); /* Internal; doesn't count */
		event_debug_unassign(&ctl->timeout_event);
		for (ev = TAILQ_FIRST(&ctl->events); ev; ) {
			struct event *next = TAILQ_NEXT(ev,
			    ev_timeout_pos.ev_next_with_common_timeout);
			if (!(ev->ev_flags & EVLIST_INTERNAL)) {
				event_del(ev);
				++n_deleted;
			}
			ev = next;
		}
		mm_free(ctl);
	}
	if (base->common_timeout_queues)
		mm_free(base->common_timeout_queues);

	for (;;) {
		/* For finalizers we can register yet another finalizer out from
		 * finalizer, and iff finalizer will be in active_later_queue we can
		 * add finalizer to activequeues, and we will have events in
		 * activequeues after this function returns, which is not what we want
		 * (we even have an assertion for this).
		 *
		 * A simple case is bufferevent with underlying (i.e. filters).
		 */
		int i = event_base_free_queues_(base, run_finalizers);
		event_debug(("%s: %d events freed", __func__, i));
		if (!i) {
			break;
		}
		n_deleted += i;
	}

	if (n_deleted)
		event_debug(("%s: %d events were still set in base",
			__func__, n_deleted));

	while (LIST_FIRST(&base->once_events)) {
		struct event_once *eonce = LIST_FIRST(&base->once_events);
		LIST_REMOVE(eonce, next_once);
		mm_free(eonce);
	}

	if (base->evsel != NULL && base->evsel->dealloc != NULL)
		base->evsel->dealloc(base);

	for (i = 0; i < base->nactivequeues; ++i)
		EVUTIL_ASSERT(TAILQ_EMPTY(&base->activequeues[i]));

	EVUTIL_ASSERT(min_heap_empty_(&base->timeheap));
	min_heap_dtor_(&base->timeheap);

	mm_free(base->activequeues);

	evmap_io_clear_(&base->io);
	evmap_signal_clear_(&base->sigmap);
	event_changelist_freemem_(&base->changelist);

	EVTHREAD_FREE_LOCK(base->th_base_lock, 0);
	EVTHREAD_FREE_COND(base->current_event_cond);

	/* If we're freeing current_base, there won't be a current_base. */
	if (base == current_base)
		current_base = NULL;
	mm_free(base);
}